

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O1

bool __thiscall
Gudhi::skeleton_blocker::
Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::equal(Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
        *this,Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
              *other)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = is_finished(this);
  if (bVar1) {
    bVar1 = is_finished(other);
  }
  else {
    bVar1 = false;
  }
  bVar2 = is_finished(this);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = is_finished(other);
  }
  bVar2 = this->complex_ == other->complex_;
  if ((bVar3 == false && bVar1 == false) && bVar2) {
    bVar1 = false;
    if ((((this->current_vertex_).vertexIterator.first.m_value ==
          (other->current_vertex_).vertexIterator.first.m_value) &&
        ((this->current_vertex_).vertexIterator.second.m_value ==
         (other->current_vertex_).vertexIterator.second.m_value)) &&
       (bVar1 = false, (this->current_vertex_).complex == (other->current_vertex_).complex)) {
      bVar1 = Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
              ::equal(&this->current_triangle_,&other->current_triangle_);
      return bVar1;
    }
  }
  else {
    bVar1 = (bool)(bVar1 & bVar2);
  }
  return bVar1;
}

Assistant:

bool equal(const Triangle_iterator& other) const {
    bool both_are_finished = is_finished() && other.is_finished();
    bool both_arent_finished = !is_finished() && !other.is_finished();
    // if the two iterators are not finished, they must have the same state
    return (complex_ == other.complex_) && (both_are_finished || ((both_arent_finished) &&
                                                                  current_vertex_ == other.current_vertex_ &&
                                                                  current_triangle_ == other.current_triangle_));
  }